

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShmSystemV.cpp
# Opt level: O0

void __thiscall adios2::transport::ShmSystemV::Close(ShmSystemV *this)

{
  string *in_RDI;
  int remove;
  int result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Transport *in_stack_fffffffffffffd00;
  allocator *paVar1;
  allocator *in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  int commRank;
  string *message;
  string *activity;
  string *component;
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [39];
  undefined1 local_221 [40];
  undefined1 local_1f9 [40];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [32];
  int local_188;
  allocator local_181;
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  undefined1 local_61 [33];
  int local_40;
  string local_29;
  
  commRank = (int)((ulong)in_stack_fffffffffffffd30 >> 0x20);
  component = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_29.field_0x1,"close",(allocator *)component);
  message = (string *)&local_29.field_0x1;
  Transport::ProfilerStart(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string((string *)message);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  local_40 = shmdt(*(void **)((long)&in_RDI[8].field_2 + 8));
  activity = (string *)local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_61 + 1),"close",(allocator *)activity);
  Transport::ProfilerStop(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string((string *)(local_61 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_61);
  if (local_40 < 1) {
    paVar1 = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Toolkit",paVar1);
    commRank = (int)((ulong)paVar1 >> 0x20);
    in_stack_fffffffffffffd28 = &local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"transport::shm::ShmSystemV",in_stack_fffffffffffffd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"Close",&local_d9);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd28);
    std::operator+((char *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    std::operator+(in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
    std::operator+(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(component,in_RDI,activity,message,commRank);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  if ((in_RDI[9]._M_string_length & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"close",&local_181);
    Transport::ProfilerStart(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    local_188 = shmctl(*(int *)((long)&in_RDI[8].field_2 + 4),0,(shmid_ds *)0x0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a8,"close",&local_1a9);
    Transport::ProfilerStop(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    if (local_188 < 1) {
      paVar1 = &local_1d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d0,"Toolkit",paVar1);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1f9 + 1),"transport::shm::ShmSystemV",(allocator *)__lhs);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_221;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_221 + 1),"Close",(allocator *)__rhs);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd28);
      std::operator+((char *)__lhs,__rhs);
      std::operator+(__lhs,(char *)__rhs);
      std::operator+(__lhs,__rhs);
      helper::Throw<std::ios_base::failure[abi:cxx11]>(component,in_RDI,activity,message,commRank);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::string::~string(local_2a8);
      std::__cxx11::string::~string((string *)(local_221 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_221);
      std::__cxx11::string::~string((string *)(local_1f9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1f9);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    }
  }
  *(undefined1 *)((long)&in_RDI[3]._M_string_length + 4) = 0;
  return;
}

Assistant:

void ShmSystemV::Close()
{
    ProfilerStart("close");
    int result = shmdt(m_Buffer);
    ProfilerStop("close");
    if (result < 1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::shm::ShmSystemV", "Close",
                                              "failed to detach shared memory segment of size " +
                                                  std::to_string(m_Size) + " and name " + m_Name);
    }

    if (m_RemoveAtClose)
    {
        ProfilerStart("close");
        const int remove = shmctl(m_ShmID, IPC_RMID, NULL);
        ProfilerStop("close");
        if (remove < 1)
        {
            helper::Throw<std::ios_base::failure>(
                "Toolkit", "transport::shm::ShmSystemV", "Close",
                "failed to remove shared memory segment of size " + std::to_string(m_Size) +
                    " and name " + m_Name);
        }
    }

    m_IsOpen = false;
}